

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O1

void __thiscall bdNode::pingRelayServers(bdNode *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  list<bdNodeId,_std::allocator<bdNodeId>_> peerList;
  _List_node_base local_30;
  undefined8 local_20;
  
  local_20 = 0;
  local_30._M_next = &local_30;
  local_30._M_prev = &local_30;
  bdFriendList::findPeersWithFlags
            (&this->mFriendList,0x80000,(list<bdNodeId,_std::allocator<bdNodeId>_> *)&local_30);
  p_Var2 = &local_30;
  while (p_Var2 = (((_List_base<bdNodeId,_std::allocator<bdNodeId>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != &local_30) {
    bdQueryManager::addQuery(this->mQueryMgr,(bdNodeId *)(p_Var2 + 1),5);
  }
  p_Var2 = local_30._M_next;
  while (p_Var2 != &local_30) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x28);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

void bdNode::pingRelayServers() {
	/* if Relay's have been switched on, do search/ping to locate servers */
#ifdef DEBUG_NODE_MSGS
	std::cerr << "bdNode::pingRelayServers()";
	std::cerr << std::endl;
#endif

	bool doSearch = true;

	uint32_t flags = BITDHT_PEER_STATUS_DHT_RELAY_SERVER;
	std::list<bdNodeId> peerList;
	std::list<bdNodeId>::iterator it;

	mFriendList.findPeersWithFlags(flags, peerList);
	for (it = peerList.begin(); it != peerList.end(); it++) {
		if (doSearch) {
			uint32_t qflags = BITDHT_QFLAGS_INTERNAL | BITDHT_QFLAGS_DISGUISE;
			mQueryMgr->addQuery(&(*it), qflags);

#ifdef DEBUG_NODE_MSGS
			std::cerr << "bdNode::pingRelayServers() Adding Internal Search for Relay Server: ";
			mFns->bdPrintNodeId(std::cerr, &(*it));
			std::cerr << std::endl;
#endif

		}
        /* try ping - if we have an address??? */
	}
}